

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
BitsEqualFailure::BitsEqualFailure
          (BitsEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          unsigned_long expected,unsigned_long actual,unsigned_long mask,size_t byteCount,
          SimpleString *text)

{
  SimpleString local_88;
  SimpleString local_78;
  undefined1 local_68 [48];
  unsigned_long local_38;
  unsigned_long actual_local;
  unsigned_long expected_local;
  size_t lineNumber_local;
  char *fileName_local;
  UtestShell *test_local;
  BitsEqualFailure *this_local;
  
  local_38 = actual;
  actual_local = expected;
  expected_local = lineNumber;
  lineNumber_local = (size_t)fileName;
  fileName_local = (char *)test;
  test_local = (UtestShell *)this;
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__BitsEqualFailure_0042ec90;
  TestFailure::createUserText((TestFailure *)(local_68 + 0x20),(SimpleString *)this);
  SimpleString::operator=(&(this->super_TestFailure).message_,(SimpleString *)(local_68 + 0x20));
  SimpleString::~SimpleString((SimpleString *)(local_68 + 0x20));
  StringFromMaskedBits((unsigned_long)&local_78,actual_local,mask);
  StringFromMaskedBits((unsigned_long)&local_88,local_38,mask);
  TestFailure::createButWasString((TestFailure *)local_68,(SimpleString *)this,&local_78);
  SimpleString::operator+=(&(this->super_TestFailure).message_,(SimpleString *)local_68);
  SimpleString::~SimpleString((SimpleString *)local_68);
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString(&local_78);
  return;
}

Assistant:

BitsEqualFailure::BitsEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, unsigned long expected, unsigned long actual,
                                   unsigned long mask, size_t byteCount, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += createButWasString(StringFromMaskedBits(expected, mask, byteCount), StringFromMaskedBits(actual, mask, byteCount));
}